

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void transcoding_test(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  unsigned_long uval;
  unsigned_long uval_00;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3fb;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  undefined1 local_3f8 [8];
  string other_to_utf8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string other_utf8;
  undefined1 local_2f8 [8];
  string other_doc;
  undefined1 local_2d0 [8];
  string other;
  string local_2a8;
  undefined1 local_288 [8];
  string utf8;
  undefined1 local_260 [8];
  string pdfdoc;
  string output;
  undefined1 local_218 [8];
  string input3;
  undefined1 local_1f0 [8];
  string input2;
  undefined1 local_1c8 [8];
  string input1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,anon_var_dwarf_4aa6,&local_29);
  transcoding_test(QUtil::pdf_doc_to_utf8,QUtil::utf8_to_pdf_doc,0x7f,0xa0,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional pdf doc done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"?",&local_61);
  transcoding_test(QUtil::pdf_doc_to_utf8,QUtil::utf8_to_pdf_doc,0x18,0x1f,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional pdf doc low done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"?",&local_89);
  transcoding_test(QUtil::win_ansi_to_utf8,QUtil::utf8_to_win_ansi,0x80,0xa0,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional win ansi done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"?",&local_b1);
  transcoding_test(QUtil::mac_roman_to_utf8,QUtil::utf8_to_mac_roman,0x80,0xff,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional mac roman done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,anon_var_dwarf_4b26,&local_d9);
  check_analyze(&local_d8,true,true,false);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,anon_var_dwarf_4b40,&local_101);
  check_analyze(&local_100,true,false,false);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"pi != 22/7",&local_129);
  check_analyze(&local_128,false,false,false);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,anon_var_dwarf_4b58,&local_151);
  check_analyze(&local_150,true,false,false);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,anon_var_dwarf_4b64,4,&local_179);
  check_analyze(&local_178,true,false,true);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,anon_var_dwarf_4b70,4,
             (allocator *)(input1.field_2._M_local_buf + 0xf));
  check_analyze(&local_1a0,true,false,true);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)(input1.field_2._M_local_buf + 0xf));
  poVar3 = std::operator<<((ostream *)&std::cout,"analysis done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,anon_var_dwarf_4b88,
             (allocator<char> *)(input2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(input2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,anon_var_dwarf_4b94,
             (allocator<char> *)(input3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(input3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,"ab",(allocator<char> *)(output.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(pdfdoc.field_2._M_local_buf + 8));
  bVar1 = QUtil::utf8_to_ascii((string *)local_1c8,(string *)(pdfdoc.field_2._M_local_buf + 8),'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_ascii(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x192,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_ascii((string *)local_1f0,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_ascii(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x193,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_ascii((string *)local_218,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_ascii(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x194,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi((string *)local_1c8,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_win_ansi(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x195,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi((string *)local_1f0,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_win_ansi(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x196,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi((string *)local_218,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_win_ansi(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x197,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman((string *)local_1c8,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_mac_roman(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x198,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman((string *)local_1f0,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_mac_roman(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x199,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman((string *)local_218,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_mac_roman(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19a,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc((string *)local_1c8,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19b,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc((string *)local_1f0,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19c,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc((string *)local_218,(string *)((long)&pdfdoc.field_2 + 8),'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19d,"void transcoding_test()");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"alternatives");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_260,anon_var_dwarf_4c9a,
             (allocator<char> *)(utf8.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(utf8.field_2._M_local_buf + 0xf));
  QUtil::pdf_doc_to_utf8((string *)local_288,(string *)local_260);
  print_alternatives((string *)local_260);
  print_alternatives((string *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"quack",(allocator<char> *)(other.field_2._M_local_buf + 0xf));
  print_alternatives(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)(other.field_2._M_local_buf + 0xf));
  poVar3 = std::operator<<((ostream *)&std::cout,"done alternatives");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"w\x18w\x19w\x1aw\x1bw\x1cw\x1dw\x1ew\x1fw\x7fw",
             (allocator<char> *)(other_doc.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(other_doc.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 anon_var_dwarf_4ce6);
  QUtil::pdf_doc_to_utf8((string *)((long)&other_utf8.field_2 + 8),(string *)local_2f8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)(other_utf8.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(other_utf8.field_2._M_local_buf + 8));
  QUtil::toUTF8_abi_cxx11_(&local_3b8,(QUtil *)0x9f,uval);
  std::operator+(&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 &local_3b8);
  std::operator+(&local_378,&local_398,anon_var_dwarf_5b61 + 4);
  QUtil::toUTF8_abi_cxx11_((string *)((long)&other_to_utf8.field_2 + 8),(QUtil *)0xad,uval_00);
  std::operator+(&local_358,&local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_to_utf8.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 &local_358,anon_var_dwarf_5b61 + 4);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)(other_to_utf8.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)local_3f8);
  bVar1 = QUtil::utf8_to_pdf_doc((string *)local_338,(string *)local_3f8,'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(other_utf8, other_to_utf8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1b2,"void transcoding_test()");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_3f8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"done other characters");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (transcoding_test()::fe_ff_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::fe_ff_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::fe_ff_abi_cxx11_,anon_var_dwarf_4d24,&local_3f9);
      std::allocator<char>::~allocator(&local_3f9);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::fe_ff_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&transcoding_test()::fe_ff_abi_cxx11_);
    }
  }
  if (transcoding_test()::ff_fe_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::ff_fe_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::ff_fe_abi_cxx11_,anon_var_dwarf_5745,&local_3fa);
      std::allocator<char>::~allocator(&local_3fa);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::ff_fe_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&transcoding_test()::ff_fe_abi_cxx11_);
    }
  }
  if (transcoding_test()::ef_bb_bf_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::ef_bb_bf_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::ef_bb_bf_abi_cxx11_,anon_var_dwarf_5751,&local_3fb);
      std::allocator<char>::~allocator(&local_3fb);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::ef_bb_bf_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&transcoding_test()::ef_bb_bf_abi_cxx11_);
    }
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::fe_ff_abi_cxx11_,(string *)local_260,'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(fe_ff, pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1bc,"void transcoding_test()");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,anon_var_dwarf_5769);
  if (!bVar1) {
    __assert_fail("pdfdoc == \"?\\xfe\\xff potato\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1bd,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::ff_fe_abi_cxx11_,(string *)local_260,'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(ff_fe, pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1be,"void transcoding_test()");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,anon_var_dwarf_578d);
  if (!bVar1) {
    __assert_fail("pdfdoc == \"?\\xff\\xfe potato\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1bf,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::ef_bb_bf_abi_cxx11_,(string *)local_260,'?');
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(ef_bb_bf, pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1c0,"void transcoding_test()");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,anon_var_dwarf_57b1);
  if (!bVar1) {
    __assert_fail("pdfdoc == \"?\\xef\\xbb\\xbf potato\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1c1,"void transcoding_test()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,anon_var_dwarf_57d7,&local_421);
  bVar1 = QUtil::utf8_to_pdf_doc(&local_420,(string *)local_260,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(\"\\xc3\\xbe\\xc3\\xbe\", pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1c2,"void transcoding_test()");
  }
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,anon_var_dwarf_57ef,&local_449);
  bVar1 = QUtil::utf8_to_pdf_doc(&local_448,(string *)local_260,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(\"\\xc3\\xaf\\xc2\\xbb\\xc2\\xbe\", pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1c3,"void transcoding_test()");
  }
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)(pdfdoc.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c8);
  return;
}

Assistant:

void
transcoding_test()
{
    transcoding_test(&QUtil::pdf_doc_to_utf8, &QUtil::utf8_to_pdf_doc, 127, 160, "\x9f");
    std::cout << "bidirectional pdf doc done" << std::endl;
    transcoding_test(&QUtil::pdf_doc_to_utf8, &QUtil::utf8_to_pdf_doc, 24, 31, "?");
    std::cout << "bidirectional pdf doc low done" << std::endl;
    transcoding_test(&QUtil::win_ansi_to_utf8, &QUtil::utf8_to_win_ansi, 128, 160, "?");
    std::cout << "bidirectional win ansi done" << std::endl;
    transcoding_test(&QUtil::mac_roman_to_utf8, &QUtil::utf8_to_mac_roman, 128, 255, "?");
    std::cout << "bidirectional mac roman done" << std::endl;
    check_analyze("pi = \317\200", true, true, false);
    check_analyze("pi != \317", true, false, false);
    check_analyze("pi != 22/7", false, false, false);
    check_analyze("\xE0\x80\x82", true, false, false);
    check_analyze(std::string("\xfe\xff\x00\x51", 4), true, false, true);
    check_analyze(std::string("\xff\xfe\x51\x00", 4), true, false, true);
    std::cout << "analysis done" << std::endl;
    std::string input1("a\302\277b");
    std::string input2("a\317\200b");
    std::string input3("ab");
    std::string output;
    assert(!QUtil::utf8_to_ascii(input1, output));
    assert(!QUtil::utf8_to_ascii(input2, output));
    assert(QUtil::utf8_to_ascii(input3, output));
    assert(QUtil::utf8_to_win_ansi(input1, output));
    assert(!QUtil::utf8_to_win_ansi(input2, output));
    assert(QUtil::utf8_to_win_ansi(input3, output));
    assert(QUtil::utf8_to_mac_roman(input1, output));
    assert(!QUtil::utf8_to_mac_roman(input2, output));
    assert(QUtil::utf8_to_mac_roman(input3, output));
    assert(QUtil::utf8_to_pdf_doc(input1, output));
    assert(!QUtil::utf8_to_pdf_doc(input2, output));
    assert(QUtil::utf8_to_pdf_doc(input3, output));
    std::cout << "alternatives" << std::endl;
    // char     name            mac     win     pdf-doc
    // U+0192   florin          304     203     206
    // U+00A9   copyright       251     251     251
    // U+00E9   eacute          216     351     351
    // U+017E   zcaron          -       236     236
    std::string pdfdoc = "\206\251\351\236";
    std::string utf8 = QUtil::pdf_doc_to_utf8(pdfdoc);
    print_alternatives(pdfdoc);
    print_alternatives(utf8);
    print_alternatives("quack");
    std::cout << "done alternatives" << std::endl;
    // These are characters are either valid in PDFDoc and invalid in
    // UTF-8 or the other way around.
    std::string other("w\x18w\x19w\x1aw\x1bw\x1cw\x1dw\x1ew\x1fw\x7fw");
    // cSpell: ignore xadw
    std::string other_doc = other + "\x9fw\xadw";
    std::cout << QUtil::pdf_doc_to_utf8(other_doc) << std::endl;
    std::string other_utf8 = other + QUtil::toUTF8(0x9f) + "w" + QUtil::toUTF8(0xad) + "w";
    std::string other_to_utf8;
    assert(!QUtil::utf8_to_pdf_doc(other_utf8, other_to_utf8));
    std::cout << other_to_utf8 << std::endl;
    std::cout << "done other characters" << std::endl;
    // These valid UTF8 strings when converted to PDFDoc would end up
    // with a byte sequence that would be recognized as UTF-8 or
    // UTF-16 rather than PDFDoc. A special case is required to store
    // them as UTF-16 rather than PDFDoc.
    static std::string fe_ff("\xc3\xbe\xc3\xbf potato");
    static std::string ff_fe("\xc3\xbf\xc3\xbe potato");
    static std::string ef_bb_bf("\xc3\xaf\xc2\xbb\xc2\xbf potato");
    assert(!QUtil::utf8_to_pdf_doc(fe_ff, pdfdoc));
    assert(pdfdoc == "?\xfe\xff potato");
    assert(!QUtil::utf8_to_pdf_doc(ff_fe, pdfdoc));
    assert(pdfdoc == "?\xff\xfe potato");
    assert(!QUtil::utf8_to_pdf_doc(ef_bb_bf, pdfdoc));
    assert(pdfdoc == "?\xef\xbb\xbf potato");
    assert(QUtil::utf8_to_pdf_doc("\xc3\xbe\xc3\xbe", pdfdoc));
    assert(QUtil::utf8_to_pdf_doc("\xc3\xaf\xc2\xbb\xc2\xbe", pdfdoc));
}